

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O0

TestCaseGroup * vkt::SpirVAssembly::createMemoryAccessTests(TestContext *testCtx)

{
  string *psVar1;
  TestCaseGroup *pTVar2;
  mapped_type *pmVar3;
  NameMemoryAccess *local_c10;
  RGBA *local_a70;
  string local_a60;
  allocator<char> local_a39;
  key_type local_a38;
  allocator<char> local_a11;
  string local_a10;
  StringTemplate local_9f0;
  string local_9d0;
  allocator<char> local_9a9;
  key_type local_9a8;
  allocator<char> local_981;
  key_type local_980;
  undefined1 local_960 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  memoryAccess;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  fragments;
  size_t testNdx;
  allocator<char> local_8f0;
  undefined1 local_8ef;
  allocator<char> local_8ee;
  allocator<char> local_8ed;
  undefined1 local_8ec;
  allocator<char> local_8eb;
  allocator<char> local_8ea;
  undefined1 local_8e9;
  allocator<char> local_8e8;
  allocator<char> local_8e7;
  undefined1 local_8e6;
  allocator<char> local_8e5;
  allocator<char> local_8e4;
  undefined1 local_8e3;
  allocator<char> local_8e2;
  allocator<char> local_8e1;
  string *local_8e0;
  undefined1 local_8d8 [8];
  NameMemoryAccess tests [7];
  char function [1519];
  char constantsAndTypes [223];
  RGBA colors [4];
  undefined1 local_28 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> memoryAccessTests;
  TestContext *testCtx_local;
  
  memoryAccessTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data._8_8_ = testCtx;
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar2,(TestContext *)
                    memoryAccessTests.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data._8_8_,"opmemoryaccess","Memory Semantics");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)((long)&colors[2].m_value + 3));
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_28,pTVar2
            );
  local_a70 = (RGBA *)(constantsAndTypes + 0xd8);
  do {
    tcu::RGBA::RGBA(local_a70);
    local_a70 = local_a70 + 1;
  } while (local_a70 != colors + 2);
  memcpy(function + 0x5e8,
         "%c_a2f32_1         = OpConstantComposite %a2f32 %c_f32_1 %c_f32_1\n%fp_a2f32          = OpTypePointer Function %a2f32\n%stype             = OpTypeStruct  %v4f32 %a2f32 %f32\n%fp_stype          = OpTypePointer Function %stype\n"
         ,0xdf);
  memcpy((void *)((long)&tests[6].accessType.field_2 + 8),
         "%test_code         = OpFunction %v4f32 None %v4f32_function\n%param1            = OpFunctionParameter %v4f32\n%lbl               = OpLabel\n%v1                = OpVariable %fp_v4f32 Function\n%v2                = OpVariable %fp_a2f32 Function\n%v3                = OpVariable %fp_f32 Function\n%v                 = OpVariable %fp_stype Function\n%vv                = OpVariable %fp_stype Function\n%vvv               = OpVariable %fp_f32 Function\n                     OpStore %v1 %c_v4f32_1_1_1_1\n                     OpStore %v2 %c_a2f32_1\n                     OpStore %v3 %c_f32_1\n%p_v4f32          = OpAccessChain %fp_v4f32 %v %c_u32_0\n%p_a2f32          = OpAccessChain %fp_a2f32 %v %c_u32_1\n%p_f32            = OpAccessChain %fp_f32 %v %c_u32_2\n%v1_v             = OpLoad %v4f32 %v1 ${access_type}\n%v2_v             = OpLoad %a2f32 %v2 ${access_type}\n%v3_v             = OpLoad %f32 %v3 ${access_type}\n                    OpStore %p_v4f32 %v1_v ${access_type}\n                    OpStore %p_a2f32 %v2_v ${access_type}\n                    OpStore %p_f32 %v3_v ${access_type}\n                    OpCopyMemory %vv %v ${access_type}\n                    OpCopyMemory %vvv %p_f32 ${access_type}\n%p_f32_2          = OpAccessChain %fp_f32 %vv %c_u32_2\n%v_f32_2          = OpLoad %f32 %p_f32_2\n%v_f32_3          = OpLoad %f32 %vvv\n%ret1             = OpVectorTimesScalar %v4f32 %param1 %v_f32_2\n%ret2             = OpVectorTimesScalar %v4f32 %ret1 %v_f32_3\n                    OpReturnValue %ret2\n                    OpFunctionEnd\n"
         ,0x5ef);
  testNdx._2_1_ = 1;
  local_8e0 = (string *)local_8d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_8d8,"none",&local_8e1);
  local_8e3 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(tests[0].name.field_2._M_local_buf + 8),"",&local_8e2);
  local_8e3 = 0;
  psVar1 = (string *)(tests[0].accessType.field_2._M_local_buf + 8);
  local_8e0 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"volatile",&local_8e4);
  local_8e6 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(tests[1].name.field_2._M_local_buf + 8),"Volatile",&local_8e5);
  local_8e6 = 0;
  psVar1 = (string *)(tests[1].accessType.field_2._M_local_buf + 8);
  local_8e0 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"aligned",&local_8e7);
  local_8e9 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(tests[2].name.field_2._M_local_buf + 8),"Aligned 1",&local_8e8);
  local_8e9 = 0;
  psVar1 = (string *)(tests[2].accessType.field_2._M_local_buf + 8);
  local_8e0 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"volatile_aligned",&local_8ea);
  local_8ec = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(tests[3].name.field_2._M_local_buf + 8),"Volatile|Aligned 1",&local_8eb);
  local_8ec = 0;
  psVar1 = (string *)(tests[3].accessType.field_2._M_local_buf + 8);
  local_8e0 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"nontemporal_aligned",&local_8ed);
  local_8ef = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(tests[4].name.field_2._M_local_buf + 8),"Nontemporal|Aligned 1",&local_8ee);
  local_8ef = 0;
  psVar1 = (string *)(tests[4].accessType.field_2._M_local_buf + 8);
  local_8e0 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"volatile_nontemporal",&local_8f0);
  testNdx._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(tests[5].name.field_2._M_local_buf + 8),"Volatile|Nontemporal",
             (allocator<char> *)((long)&testNdx + 7));
  testNdx._6_1_ = 0;
  psVar1 = (string *)(tests[5].accessType.field_2._M_local_buf + 8);
  local_8e0 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (psVar1,"volatile_nontermporal_aligned",(allocator<char> *)((long)&testNdx + 5));
  testNdx._3_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(tests[6].name.field_2._M_local_buf + 8),"Volatile|Nontemporal|Aligned 1",
             (allocator<char> *)((long)&testNdx + 4));
  testNdx._3_1_ = 0;
  testNdx._2_1_ = 0;
  std::allocator<char>::~allocator((allocator<char> *)((long)&testNdx + 4));
  std::allocator<char>::~allocator((allocator<char> *)((long)&testNdx + 5));
  std::allocator<char>::~allocator((allocator<char> *)((long)&testNdx + 7));
  std::allocator<char>::~allocator(&local_8f0);
  std::allocator<char>::~allocator(&local_8ee);
  std::allocator<char>::~allocator(&local_8ed);
  std::allocator<char>::~allocator(&local_8eb);
  std::allocator<char>::~allocator(&local_8ea);
  std::allocator<char>::~allocator(&local_8e8);
  std::allocator<char>::~allocator(&local_8e7);
  std::allocator<char>::~allocator(&local_8e5);
  std::allocator<char>::~allocator(&local_8e4);
  std::allocator<char>::~allocator(&local_8e2);
  std::allocator<char>::~allocator(&local_8e1);
  getHalfColorsFullAlpha((RGBA (*) [4])(constantsAndTypes + 0xd8));
  for (fragments._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      fragments._M_t._M_impl.super__Rb_tree_header._M_node_count < 7;
      fragments._M_t._M_impl.super__Rb_tree_header._M_node_count =
           fragments._M_t._M_impl.super__Rb_tree_header._M_node_count + 1) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)&memoryAccess._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)local_960);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_980,"access_type",&local_981);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_960,&local_980);
    std::__cxx11::string::operator=
              ((string *)pmVar3,
               (string *)
               (tests[fragments._M_t._M_impl.super__Rb_tree_header._M_node_count].name.field_2.
                _M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_980);
    std::allocator<char>::~allocator(&local_981);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_9a8,"pre_main",&local_9a9);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&memoryAccess._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          &local_9a8);
    std::__cxx11::string::operator=((string *)pmVar3,function + 0x5e8);
    std::__cxx11::string::~string((string *)&local_9a8);
    std::allocator<char>::~allocator(&local_9a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a10,tests[6].accessType.field_2._M_local_buf + 8,&local_a11);
    tcu::StringTemplate::StringTemplate(&local_9f0,&local_a10);
    tcu::StringTemplate::specialize
              (&local_9d0,&local_9f0,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_960);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a38,"testfun",&local_a39);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&memoryAccess._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          &local_a38);
    std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_9d0);
    std::__cxx11::string::~string((string *)&local_a38);
    std::allocator<char>::~allocator(&local_a39);
    std::__cxx11::string::~string((string *)&local_9d0);
    tcu::StringTemplate::~StringTemplate(&local_9f0);
    std::__cxx11::string::~string((string *)&local_a10);
    std::allocator<char>::~allocator(&local_a11);
    pTVar2 = de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
             get((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_28
                );
    std::__cxx11::string::string((string *)&local_a60);
    createTestsForAllStages
              ((string *)
               ((long)&tests[fragments._M_t._M_impl.super__Rb_tree_header._M_node_count - 1].
                       accessType.field_2 + 8),(RGBA (*) [4])(constantsAndTypes + 0xd8),
               (RGBA (*) [4])(constantsAndTypes + 0xd8),
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&memoryAccess._M_t._M_impl.super__Rb_tree_header._M_node_count,pTVar2,
               QP_TEST_RESULT_FAIL,&local_a60);
    std::__cxx11::string::~string((string *)&local_a60);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_960);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&memoryAccess._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  pTVar2 = de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
           release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_28)
  ;
  local_c10 = (NameMemoryAccess *)((long)&tests[6].accessType.field_2 + 8);
  do {
    local_c10 = local_c10 + -1;
    createMemoryAccessTests::NameMemoryAccess::~NameMemoryAccess(local_c10);
  } while (local_c10 != (NameMemoryAccess *)local_8d8);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_28);
  return pTVar2;
}

Assistant:

tcu::TestCaseGroup* createMemoryAccessTests(tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> memoryAccessTests (new tcu::TestCaseGroup(testCtx, "opmemoryaccess", "Memory Semantics"));
	RGBA							colors[4];

	const char						constantsAndTypes[]	 =
		"%c_a2f32_1         = OpConstantComposite %a2f32 %c_f32_1 %c_f32_1\n"
		"%fp_a2f32          = OpTypePointer Function %a2f32\n"
		"%stype             = OpTypeStruct  %v4f32 %a2f32 %f32\n"
		"%fp_stype          = OpTypePointer Function %stype\n";

	const char						function[]	 =
		"%test_code         = OpFunction %v4f32 None %v4f32_function\n"
		"%param1            = OpFunctionParameter %v4f32\n"
		"%lbl               = OpLabel\n"
		"%v1                = OpVariable %fp_v4f32 Function\n"
		"%v2                = OpVariable %fp_a2f32 Function\n"
		"%v3                = OpVariable %fp_f32 Function\n"
		"%v                 = OpVariable %fp_stype Function\n"
		"%vv                = OpVariable %fp_stype Function\n"
		"%vvv               = OpVariable %fp_f32 Function\n"

		"                     OpStore %v1 %c_v4f32_1_1_1_1\n"
		"                     OpStore %v2 %c_a2f32_1\n"
		"                     OpStore %v3 %c_f32_1\n"

		"%p_v4f32          = OpAccessChain %fp_v4f32 %v %c_u32_0\n"
		"%p_a2f32          = OpAccessChain %fp_a2f32 %v %c_u32_1\n"
		"%p_f32            = OpAccessChain %fp_f32 %v %c_u32_2\n"
		"%v1_v             = OpLoad %v4f32 %v1 ${access_type}\n"
		"%v2_v             = OpLoad %a2f32 %v2 ${access_type}\n"
		"%v3_v             = OpLoad %f32 %v3 ${access_type}\n"

		"                    OpStore %p_v4f32 %v1_v ${access_type}\n"
		"                    OpStore %p_a2f32 %v2_v ${access_type}\n"
		"                    OpStore %p_f32 %v3_v ${access_type}\n"

		"                    OpCopyMemory %vv %v ${access_type}\n"
		"                    OpCopyMemory %vvv %p_f32 ${access_type}\n"

		"%p_f32_2          = OpAccessChain %fp_f32 %vv %c_u32_2\n"
		"%v_f32_2          = OpLoad %f32 %p_f32_2\n"
		"%v_f32_3          = OpLoad %f32 %vvv\n"

		"%ret1             = OpVectorTimesScalar %v4f32 %param1 %v_f32_2\n"
		"%ret2             = OpVectorTimesScalar %v4f32 %ret1 %v_f32_3\n"
		"                    OpReturnValue %ret2\n"
		"                    OpFunctionEnd\n";

	struct NameMemoryAccess
	{
		string name;
		string accessType;
	};


	NameMemoryAccess tests[] =
	{
		{ "none", "" },
		{ "volatile", "Volatile" },
		{ "aligned",  "Aligned 1" },
		{ "volatile_aligned",  "Volatile|Aligned 1" },
		{ "nontemporal_aligned",  "Nontemporal|Aligned 1" },
		{ "volatile_nontemporal",  "Volatile|Nontemporal" },
		{ "volatile_nontermporal_aligned",  "Volatile|Nontemporal|Aligned 1" },
	};

	getHalfColorsFullAlpha(colors);

	for (size_t testNdx = 0; testNdx < sizeof(tests) / sizeof(NameMemoryAccess); ++testNdx)
	{
		map<string, string> fragments;
		map<string, string> memoryAccess;
		memoryAccess["access_type"] = tests[testNdx].accessType;

		fragments["pre_main"] = constantsAndTypes;
		fragments["testfun"] = tcu::StringTemplate(function).specialize(memoryAccess);
		createTestsForAllStages(tests[testNdx].name, colors, colors, fragments, memoryAccessTests.get());
	}
	return memoryAccessTests.release();
}